

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_xmi.cpp
# Opt level: O0

uint __thiscall iff_chunk::get_chunk_count(iff_chunk *this,char *p_id)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong local_28;
  size_t i;
  uint chunk_count;
  char *p_id_local;
  iff_chunk *this_local;
  
  i._4_4_ = 0;
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<iff_chunk,_std::allocator<iff_chunk>_>::size(&this->m_sub_chunks);
    if (sVar1 <= local_28) break;
    pvVar2 = std::vector<iff_chunk,_std::allocator<iff_chunk>_>::operator[]
                       (&this->m_sub_chunks,local_28);
    if (*(int *)p_id == *(int *)pvVar2->m_id) {
      i._4_4_ = i._4_4_ + 1;
    }
    local_28 = local_28 + 1;
  }
  return i._4_4_;
}

Assistant:

unsigned get_chunk_count( const char * p_id ) const
    {
        unsigned chunk_count = 0;
        for ( std::size_t i = 0; i < m_sub_chunks.size(); ++i )
        {
            if ( !memcmp( p_id, m_sub_chunks[ i ].m_id, 4 ) )
            {
                ++chunk_count;
            }
        }
        return chunk_count;
    }